

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O0

void sort(void *b_,ReduceProxy *srp,SortPartners *partners)

{
  bool bVar1;
  uint extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  size_t sVar3;
  SortPartners *in_RDX;
  ReduceProxy *in_RSI;
  ReduceProxy *in_RDI;
  double in_XMM0_Qa;
  double __x;
  double __x_00;
  double __x_01;
  Histogram *unaff_retaddr;
  ReduceProxy *in_stack_00000008;
  void *in_stack_00000010;
  ReduceProxy *in_stack_00000028;
  void *in_stack_00000030;
  Histogram histogram;
  Histogram *in_stack_00000130;
  ReduceProxy *in_stack_00000138;
  void *in_stack_00000140;
  int in_stack_ffffffffffffff9c;
  SortPartners *in_stack_ffffffffffffffa0;
  ReduceProxy *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  SortPartners *this;
  
  diy::ReduceProxy::round(in_RSI,in_XMM0_Qa);
  sVar3 = SortPartners::rounds((SortPartners *)0x1121de);
  if (extraout_EAX == sVar3) {
    dequeue_exchange(histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (ReduceProxy *)
                     histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
    sort_local(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    this = in_RDX;
    diy::ReduceProxy::round(in_RSI,__x);
    bVar1 = SortPartners::exchange_round(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (bVar1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x112243);
      receive_histogram(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      enqueue_exchange(in_stack_00000140,in_stack_00000138,in_stack_00000130);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
    }
    else {
      diy::ReduceProxy::round(in_RSI,__x_00);
      iVar2 = SortPartners::sub_round(in_RDX,in_stack_ffffffffffffff9c);
      if (iVar2 == 0) {
        diy::ReduceProxy::round(in_RSI,__x_01);
        if (extraout_EAX_00 != 0) {
          dequeue_exchange(histogram.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
                           (ReduceProxy *)
                           histogram.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
        }
        compute_local_histogram(in_stack_00000030,in_stack_00000028);
      }
      else {
        add_histogram(unaff_retaddr,in_RDI);
      }
    }
  }
  return;
}

Assistant:

void sort(void* b_, const diy::ReduceProxy& srp, const SortPartners& partners)
{
    if (srp.round() == partners.rounds())
    {
        dequeue_exchange(b_, srp);
        sort_local(b_, srp);
    }
    else if (partners.exchange_round(srp.round()))
    {
        Histogram histogram;
        receive_histogram(b_, srp, histogram);
        enqueue_exchange(b_, srp, histogram);
    } else if (partners.sub_round(srp.round()) == 0)
    {
        if (srp.round() > 0)
            dequeue_exchange(b_, srp);

        compute_local_histogram(b_, srp);
    } else
        add_histogram(b_, srp);
}